

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::NodeLoader15::begin__instance_material____instance_material_type(NodeLoader15 *this)

{
  instance_material____instance_material_type__AttributeData *in_RSI;
  
  begin__instance_material____instance_material_type
            ((NodeLoader15 *)&this[-1].super_IParserImpl15.super_ColladaParserAutoGen15,in_RSI);
  return;
}

Assistant:

bool NodeLoader15::begin__instance_material____instance_material_type( const COLLADASaxFWL15::instance_material____instance_material_type__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_material____instance_material_type(attributeData));
COLLADASaxFWL::instance_material__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.symbol = attributeData.symbol;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_material____instance_material_type__AttributeData::ATTRIBUTE_TARGET_PRESENT) == COLLADASaxFWL15::instance_material____instance_material_type__AttributeData::ATTRIBUTE_TARGET_PRESENT ) {
    attrData.target = attributeData.target;
    attrData.present_attributes |= COLLADASaxFWL::instance_material__AttributeData::ATTRIBUTE_TARGET_PRESENT;
}
return mLoader->begin__instance_material(attrData);
}